

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beast_Journal.cpp
# Opt level: O2

void __thiscall jbcoin::Logs::Sink::Sink(Sink *this,string *partition,Severity thresh,Logs *logs)

{
  (this->super_Sink).thresh_ = thresh;
  (this->super_Sink).m_console = false;
  (this->super_Sink)._vptr_Sink = (_func_int **)&PTR__Sink_002f8470;
  this->logs_ = logs;
  std::__cxx11::string::string((string *)&this->partition_,(string *)partition);
  return;
}

Assistant:

Journal::Sink::Sink (Severity thresh, bool console)
    : thresh_ (thresh)
    , m_console (console)
{
}